

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

target_ulong helper_vextuwrx_ppc64(target_ulong a,ppc_avr_t *b)

{
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  Int128 *pIVar1;
  uint64_t uVar2;
  undefined8 extraout_RDX;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  int index;
  ppc_avr_t *b_local;
  target_ulong a_local;
  
  a_00._8_8_ = in_stack_ffffffffffffffb0;
  a_00._0_8_ = in_stack_ffffffffffffffa8;
  pIVar1 = int128_rshift((Int128 *)b->u64[0],(Int128)a_00,(int)b->s64[1]);
  a_01._8_8_ = extraout_RDX;
  a_01._0_8_ = pIVar1;
  uVar2 = int128_getlo((Int128)a_01);
  return uVar2 & 0xffffffff;
}

Assistant:

void helper_vslv(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i;
    unsigned int shift, bytes, size;

    size = ARRAY_SIZE(r->u8);
    for (i = 0; i < size; i++) {
        shift = b->VsrB(i) & 0x7;             /* extract shift value */
        bytes = (a->VsrB(i) << 8) +           /* extract adjacent bytes */
            (((i + 1) < size) ? a->VsrB(i + 1) : 0);
        r->VsrB(i) = (bytes << shift) >> 8;   /* shift and store result */
    }
}